

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.h
# Opt level: O3

bool __thiscall
llvm::cl::opt<(anonymous_namespace)::HelpPrinterWrapper,_true,_llvm::cl::parser<bool>_>::
handleOccurrence(opt<(anonymous_namespace)::HelpPrinterWrapper,_true,_llvm::cl::parser<bool>_> *this
                ,uint pos,StringRef ArgName,StringRef Arg)

{
  HelpPrinterWrapper *pHVar1;
  bool bVar2;
  HelpPrinter *this_00;
  parser_data_type Val;
  bool local_19;
  
  local_19 = false;
  bVar2 = parser<bool>::parse((parser<bool> *)this,&this->super_Option,ArgName,Arg,&local_19);
  if (!bVar2) {
    pHVar1 = (this->super_opt_storage<(anonymous_namespace)::HelpPrinterWrapper,_true,_true>).
             Location;
    if (pHVar1 == (HelpPrinterWrapper *)0x0) {
      __assert_fail("Location && \"cl::location(...) not specified for a command \" \"line option with external storage, \" \"or cl::init specified before cl::location()!!\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/Support/CommandLine.h"
                    ,0x4ad,
                    "void llvm::cl::opt_storage<(anonymous namespace)::HelpPrinterWrapper, true, true>::check_location() const [DataType = (anonymous namespace)::HelpPrinterWrapper, ExternalStorage = true, isClass = true]"
                   );
    }
    if ((local_19 & 1U) != 0) {
      if (GlobalParser.super_ManagedStaticBase.Ptr._M_b._M_p == (__pointer_type)0x0) {
        ManagedStaticBase::RegisterManagedStatic
                  (&GlobalParser.super_ManagedStaticBase,
                   object_creator<(anonymous_namespace)::CommandLineParser>::call,
                   object_deleter<(anonymous_namespace)::CommandLineParser>::call);
      }
      if ((uint)(*(int *)((long)GlobalParser.super_ManagedStaticBase.Ptr._M_b._M_p + 0x5c) -
                *(int *)((long)GlobalParser.super_ManagedStaticBase.Ptr._M_b._M_p + 0x60)) < 2) {
        this_00 = pHVar1->UncategorizedPrinter;
      }
      else {
        HLOp.super_Option._12_1_ = HLOp.super_Option._12_1_ & 0x9f;
        this_00 = &pHVar1->CategorizedPrinter->super_HelpPrinter;
      }
      anon_unknown.dwarf_15dfe6::HelpPrinter::printHelp(this_00);
      exit(0);
    }
    (this->super_Option).Position = pos;
  }
  return bVar2;
}

Assistant:

bool handleOccurrence(unsigned pos, StringRef ArgName,
                        StringRef Arg) override {
    typename ParserClass::parser_data_type Val =
        typename ParserClass::parser_data_type();
    if (Parser.parse(*this, ArgName, Arg, Val))
      return true; // Parse error!
    this->setValue(Val);
    this->setPosition(pos);
    return false;
  }